

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall FIX::double_conversion::Bignum::AssignBignum(Bignum *this,Bignum *other)

{
  uint uVar1;
  uint *puVar2;
  int i;
  int index;
  int i_1;
  int index_00;
  
  this->exponent_ = other->exponent_;
  for (index = 0; index_00 = other->used_digits_, index < index_00; index = index + 1) {
    puVar2 = Vector<unsigned_int>::operator[](&other->bigits_,index);
    uVar1 = *puVar2;
    puVar2 = Vector<unsigned_int>::operator[](&this->bigits_,index);
    *puVar2 = uVar1;
  }
  for (; index_00 < this->used_digits_; index_00 = index_00 + 1) {
    puVar2 = Vector<unsigned_int>::operator[](&this->bigits_,index_00);
    *puVar2 = 0;
  }
  this->used_digits_ = other->used_digits_;
  return;
}

Assistant:

void Bignum::AssignBignum(const Bignum& other) {
  exponent_ = other.exponent_;
  for (int i = 0; i < other.used_digits_; ++i) {
    bigits_[i] = other.bigits_[i];
  }
  // Clear the excess digits (if there were any).
  for (int i = other.used_digits_; i < used_digits_; ++i) {
    bigits_[i] = 0;
  }
  used_digits_ = other.used_digits_;
}